

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

int64_t __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::ConnectIndex
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,int con)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  long *plVar3;
  int in_ESI;
  long *in_RDI;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  if ((-1 < in_ESI) && (iVar1 = (**(code **)(*in_RDI + 0x90))(), in_ESI < iVar1)) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 10),(long)in_ESI);
    return *plVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "virtual int64_t TPZCompElHCurl<pzshape::TPZShapeQuad>::ConnectIndex(int) const [TSHAPE = pzshape::TPZShapeQuad]"
                          );
  poVar2 = std::operator<<(poVar2," wrong parameter connect ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
  poVar2 = std::operator<<(poVar2," NConnects ");
  iVar1 = (**(code **)(*in_RDI + 0x90))();
  this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  return -1;
}

Assistant:

int64_t TPZCompElHCurl<TSHAPE>::ConnectIndex(int con) const{
#ifndef PZNODEBUG
    if(con <0 || con >= this->NConnects()) {
        std::cout <<__PRETTY_FUNCTION__ <<" wrong parameter connect " << con <<
                  " NConnects " << this-> NConnects() << std::endl;
        DebugStop();
        return -1;
    }

#endif
    return this->fConnectIndexes[con];
}